

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall QWidgetTextControl::setCursorWidth(QWidgetTextControl *this,int width)

{
  QStyle *pQVar1;
  QWidget *pQVar2;
  QObject *this_00;
  int in_ESI;
  QWidgetTextControlPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidgetTextControlPrivate *d;
  QObject *in_stack_ffffffffffffff98;
  int local_34;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QWidgetTextControl *)0x7110ae);
  local_34 = in_ESI;
  if (in_ESI == -1) {
    pQVar1 = QApplication::style();
    QObject::parent((QObject *)0x7110ce);
    pQVar2 = qobject_cast<QWidget*>(in_stack_ffffffffffffff98);
    local_34 = (**(code **)(*(long *)pQVar1 + 0xe0))(pQVar1,0x52,0,pQVar2);
  }
  this_00 = (QObject *)QTextDocument::documentLayout();
  ::QVariant::QVariant(&local_28,local_34);
  QObject::setProperty(this_00,(char *)in_stack_ffffffffffffff98,(QVariant *)0x71112e);
  ::QVariant::~QVariant(&local_28);
  QWidgetTextControlPrivate::repaintCursor(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControl::setCursorWidth(int width)
{
    Q_D(QWidgetTextControl);
    if (width == -1)
        width = QApplication::style()->pixelMetric(QStyle::PM_TextCursorWidth, nullptr, qobject_cast<QWidget *>(parent()));
    d->doc->documentLayout()->setProperty("cursorWidth", width);
    d->repaintCursor();
}